

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O3

pid_t phosg::pid_for_name(string *name,bool search_commands,bool exclude_self)

{
  long *plVar1;
  __pid_t _Var2;
  char *pcVar3;
  runtime_error *this;
  out_of_range *this_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 with_commands;
  undefined7 in_register_00000011;
  int iVar4;
  __node_base _Var5;
  string lower_it_name;
  string lower_name;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  tolower((phosg *)local_88,(int)name);
  _Var2 = 0;
  with_commands = extraout_DL;
  if ((int)CONCAT71(in_register_00000011,exclude_self) != 0) {
    _Var2 = getpid();
    with_commands = extraout_DL_00;
  }
  list_processes_abi_cxx11_
            ((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_68,(phosg *)(ulong)search_commands,(bool)with_commands);
  if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    ::std::
    _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  else {
    iVar4 = 0;
    _Var5._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      tolower((phosg *)local_a8,(int)_Var5._M_nxt + 0x10);
      plVar1 = local_a8[0];
      pcVar3 = strstr((char *)local_a8[0],(char *)local_88[0]);
      if ((pcVar3 != (char *)0x0) && (iVar4 != _Var2)) {
        if (iVar4 != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(this,"multiple processes found");
          __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar4 = *(int *)&_Var5._M_nxt[1]._M_nxt;
      }
      if (plVar1 != local_98) {
        operator_delete(plVar1,local_98[0] + 1);
      }
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
    } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
    ::std::
    _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (iVar4 != 0) {
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      return iVar4;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"no processes found");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

pid_t pid_for_name(const string& name, bool search_commands, bool exclude_self) {
  string lower_name = tolower(name);

  pid_t self_pid = exclude_self ? getpid() : 0;

  pid_t pid = 0;
  for (const auto& it : list_processes(search_commands)) {
    string lower_it_name = tolower(it.second);
    if (!strstr(lower_it_name.c_str(), lower_name.c_str())) {
      continue;
    }

    if (pid == self_pid) {
      continue;
    }
    if (pid) {
      throw runtime_error("multiple processes found");
    }
    pid = it.first;
  }

  if (pid) {
    return pid;
  }

  throw out_of_range("no processes found");
}